

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O1

void isobusfs_log(log_level_t level,char *fmt,...)

{
  int iVar1;
  char in_AL;
  tm *__tp;
  size_t sVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar4;
  long lVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  timeval tv;
  va_list args;
  char time_buffer [64];
  char complete_log_entry [256];
  char log_entry [192];
  timeval tStack_318;
  undefined8 local_308;
  __suseconds_t *local_300;
  undefined1 *local_2f8;
  undefined1 local_2e8 [16];
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  char local_238 [64];
  char local_1f8 [256];
  char local_f8 [200];
  
  if (in_AL != '\0') {
    local_2b8 = in_XMM0_Qa;
    local_2a8 = in_XMM1_Qa;
    local_298 = in_XMM2_Qa;
    local_288 = in_XMM3_Qa;
    local_278 = in_XMM4_Qa;
    local_268 = in_XMM5_Qa;
    local_258 = in_XMM6_Qa;
    local_248 = in_XMM7_Qa;
  }
  if (level <= log_level) {
    if (level < (LOG_LEVEL_DEBUG|LOG_LEVEL_ERROR)) {
      pcVar4 = &DAT_001030e0 + *(int *)(&DAT_001030e0 + (ulong)level * 4);
    }
    else {
      pcVar4 = "UNKNOWN";
    }
    local_2d8 = in_RDX;
    local_2d0 = in_RCX;
    local_2c8 = in_R8;
    local_2c0 = in_R9;
    gettimeofday(&tStack_318,(__timezone_ptr_t)0x0);
    __tp = localtime(&tStack_318.tv_sec);
    strftime(local_238,0x40,"%Y-%m-%d %H:%M:%S",__tp);
    sVar2 = strlen(local_238);
    snprintf(local_238 + sVar2,0x40 - sVar2,".%03d",
             (ulong)(uint)((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(tStack_318.tv_usec),8)
                                >> 7) -
                          (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(tStack_318.tv_usec),0xc) >>
                          0x1f)));
    local_308 = 0x3000000010;
    local_300 = &tv.tv_usec;
    local_2f8 = local_2e8;
    vsnprintf(local_f8,0xc0,fmt,&local_308);
    snprintf(local_1f8,0x100,"[%.40s] [%.10s]: %.150s",local_238,pcVar4,local_f8);
    iVar1 = log_buffer.write_index;
    if (interactive_mode == true) {
      lVar5 = (long)log_buffer.write_index;
      strncpy(log_buffer.buffer[lVar5],local_1f8,0x100);
      log_buffer.buffer[lVar5][0xff] = '\0';
      uVar3 = iVar1 + 0x400;
      if (-1 < (int)(iVar1 + 1U)) {
        uVar3 = iVar1 + 1U;
      }
      log_buffer.write_index = (iVar1 - (uVar3 & 0xfffffc00)) + 1;
      if (level == LOG_LEVEL_INT) {
        fputs(local_f8,_stdout);
        fflush(_stdout);
      }
    }
    else {
      fprintf(_stdout,"%s\n",local_1f8);
    }
  }
  return;
}

Assistant:

void isobusfs_log(log_level_t level, const char *fmt, ...)
{
	char complete_log_entry[LOG_ENTRY_MAX_SIZE];
	char log_entry[LOG_ENTRY_MAX_SIZE - 64];
	const char *level_str;
	struct timeval tv;
	struct tm *time_info;
	char time_buffer[64];
	int milliseconds;
	va_list args;

	if (level > log_level)
		return;

	switch (level) {
	case LOG_LEVEL_DEBUG:
		level_str = "DEBUG";
		break;
	case LOG_LEVEL_INT:
	case LOG_LEVEL_INFO:
		level_str = "INFO";
		break;
	case LOG_LEVEL_WARN:
		level_str = "WARNING";
		break;
	case LOG_LEVEL_ERROR:
		level_str = "ERROR";
		break;
	default:
		level_str = "UNKNOWN";
		break;
	}

	gettimeofday(&tv, NULL);
	time_info = localtime(&tv.tv_sec);
	milliseconds = tv.tv_usec / 1000;
	strftime(time_buffer, sizeof(time_buffer), "%Y-%m-%d %H:%M:%S",
		 time_info);
	snprintf(time_buffer + strlen(time_buffer),
		 sizeof(time_buffer) - strlen(time_buffer),
		 ".%03d", milliseconds);

	va_start(args, fmt);
	vsnprintf(log_entry, sizeof(log_entry), fmt, args);
	va_end(args);

	snprintf(complete_log_entry, sizeof(complete_log_entry),
		 "[%.40s] [%.10s]: %.150s", time_buffer, level_str, log_entry);

	if (interactive_mode) {
		add_log_to_buffer(complete_log_entry);
		if (level == LOG_LEVEL_INT) {
			fprintf(stdout, "%s", log_entry);
			fflush(stdout);
		}
	} else {
		fprintf(stdout, "%s\n", complete_log_entry);
	}
}